

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFuture.cpp
# Opt level: O3

void testFuture(void)

{
  usize *puVar1;
  Data *pDVar2;
  code *pcVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  FutureTest t;
  FutureTest t_2;
  FutureTest t_3;
  Future<void> future;
  FutureTest t_4;
  FutureTest t_8;
  String local_170;
  String local_148;
  String local_120;
  Future<unsigned_long> local_f8;
  String local_80;
  String local_58;
  
  Signal::Signal((Signal *)&local_f8,false);
  local_f8.future._joinable = false;
  local_f8.future._state = 0;
  local_f8.future._aborting = false;
  puVar5 = (undefined8 *)operator_new(0x10);
  *puVar5 = testFuture::FutureTest::staticVoidTest0;
  puVar5[1] = &local_f8;
  Future<void>::startProc(&local_f8.future,Future<void>::proc<Call<void>::Args0>,puVar5);
  Future<void>::join(&local_f8.future);
  if ((((local_f8.future._aborting != true) ||
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                              ,0x9c,"!future.isAborting()"), iVar4 == 0)) &&
      ((local_f8.future._state == 2 ||
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                              ,0x9d,"future.isFinished()"), iVar4 == 0)))) &&
     ((local_f8.future._state != 3 ||
      (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                             ,0x9e,"!future.isAborted()"), iVar4 == 0)))) {
    Future<void>::~Future(&local_f8.future);
    Signal::Signal((Signal *)&local_f8,false);
    local_f8.future._aborting = false;
    local_f8.future._state = 0;
    local_f8.future._joinable = false;
    puVar5 = (undefined8 *)operator_new(0x18);
    *puVar5 = testFuture::FutureTest::staticVoidTest1;
    *(undefined4 *)(puVar5 + 1) = 0x20;
    puVar5[2] = &local_f8;
    Future<void>::startProc(&local_f8.future,Future<void>::proc<Call<void>::Args1<int,int>>,puVar5);
    Future<void>::join(&local_f8.future);
    Future<void>::~Future(&local_f8.future);
    Signal::Signal((Signal *)&local_f8,false);
    local_f8.future._aborting = false;
    local_f8.future._state = 0;
    local_f8.future._joinable = false;
    local_148.data = (Data *)CONCAT44(local_148.data._4_4_,0x20);
    pDVar2 = &local_170._data;
    local_170._data.ref = 0;
    local_170._data.str = "hallo1";
    local_170._data.len = 6;
    local_170.data = pDVar2;
    Future<void>::start<int,String_const&,int,String>
              (&local_f8.future,testFuture::FutureTest::staticVoidTest2,(int *)&local_148,&local_170
              );
    if ((local_170.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_170.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
        operator_delete__(local_170.data);
      }
    }
    Future<void>::join(&local_f8.future);
    Future<void>::~Future(&local_f8.future);
    Signal::Signal((Signal *)&local_f8,false);
    local_f8.future._aborting = false;
    local_f8.future._state = 0;
    local_f8.future._joinable = false;
    local_120.data = (Data *)CONCAT44(local_120.data._4_4_,0x20);
    local_170._data.ref = 0;
    local_170._data.str = "hallo1";
    local_170._data.len = 6;
    local_148.data = &local_148._data;
    local_148._data.ref = 0;
    local_148._data.str = "hallo2";
    local_148._data.len = 6;
    local_170.data = pDVar2;
    Future<void>::start<int,String_const&,String_const&,int,String,String>
              (&local_f8.future,testFuture::FutureTest::staticVoidTest3,(int *)&local_120,&local_170
               ,&local_148);
    if ((local_148.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_148.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
        operator_delete__(local_148.data);
      }
    }
    if ((local_170.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_170.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
        operator_delete__(local_170.data);
      }
    }
    Future<void>::join(&local_f8.future);
    Future<void>::~Future(&local_f8.future);
    Signal::Signal((Signal *)&local_f8,false);
    local_f8.future._aborting = false;
    local_f8.future._state = 0;
    local_f8.future._joinable = false;
    local_80.data = (Data *)CONCAT44(local_80.data._4_4_,0x20);
    local_170._data.ref = 0;
    local_170._data.str = "hallo1";
    local_170._data.len = 6;
    local_148.data = &local_148._data;
    local_148._data.ref = 0;
    local_148._data.str = "hallo2";
    local_148._data.len = 6;
    local_120.data = &local_120._data;
    local_120._data.ref = 0;
    local_120._data.str = "hallo3";
    local_120._data.len = 6;
    local_170.data = pDVar2;
    Future<void>::start<int,String_const&,String_const&,String_const&,int,String,String,String>
              (&local_f8.future,testFuture::FutureTest::staticVoidTest4,(int *)&local_80,&local_170,
               &local_148,&local_120);
    if ((local_120.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_120.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
        operator_delete__(local_120.data);
      }
    }
    if ((local_148.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_148.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
        operator_delete__(local_148.data);
      }
    }
    if ((local_170.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_170.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
        operator_delete__(local_170.data);
      }
    }
    Future<void>::join(&local_f8.future);
    Future<void>::~Future(&local_f8.future);
    Signal::Signal((Signal *)&local_f8,false);
    local_f8.future._aborting = false;
    local_f8.future._state = 0;
    local_f8.future._joinable = false;
    local_58.data = (Data *)CONCAT44(local_58.data._4_4_,0x20);
    local_170._data.ref = 0;
    local_170._data.str = "hallo1";
    local_170._data.len = 6;
    local_148.data = &local_148._data;
    local_148._data.ref = 0;
    local_148._data.str = "hallo2";
    local_148._data.len = 6;
    local_120.data = &local_120._data;
    local_120._data.ref = 0;
    local_120._data.str = "hallo3";
    local_120._data.len = 6;
    local_80.data = &local_80._data;
    local_80._data.ref = 0;
    local_80._data.str = "hallo4";
    local_80._data.len = 6;
    local_170.data = pDVar2;
    Future<void>::
    start<int,String_const&,String_const&,String_const&,String_const&,int,String,String,String,String>
              (&local_f8.future,testFuture::FutureTest::staticVoidTest5,(int *)&local_58,&local_170,
               &local_148,&local_120,&local_80);
    if ((local_80.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_80.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
        operator_delete__(local_80.data);
      }
    }
    if ((local_120.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_120.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
        operator_delete__(local_120.data);
      }
    }
    if ((local_148.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_148.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
        operator_delete__(local_148.data);
      }
    }
    if ((local_170.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_170.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
        operator_delete__(local_170.data);
      }
    }
    Future<void>::join(&local_f8.future);
    Future<void>::~Future(&local_f8.future);
    Signal::Signal((Signal *)&local_f8,false);
    local_f8.future._aborting = false;
    local_f8.future._state = 0;
    local_f8.future._joinable = false;
    local_170.data = (Data *)CONCAT44(0x2a,local_170.data._0_4_);
    puVar5 = (undefined8 *)operator_new(0x20);
    *puVar5 = &local_170;
    puVar5[1] = testFuture::FutureTest::memberVoidTest0;
    puVar5[2] = 0;
    puVar5[3] = &local_f8;
    Future<void>::startProc
              (&local_f8.future,
               Future<void>::proc<Call<void>::Member<testFuture()::FutureTest>::Args0>,puVar5);
    Future<void>::join(&local_f8.future);
    if (((char)local_170.data != '\0') ||
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                              ,0xc4,"t.called"), iVar4 == 0)) {
      Future<void>::~Future(&local_f8.future);
      Signal::Signal((Signal *)&local_f8,false);
      local_f8.future._aborting = false;
      local_f8.future._state = 0;
      local_f8.future._joinable = false;
      local_170.data = (Data *)CONCAT44(0x2a,local_170.data._0_4_);
      puVar5 = (undefined8 *)operator_new(0x28);
      *puVar5 = &local_170;
      puVar5[1] = testFuture::FutureTest::memberVoidTest1;
      puVar5[2] = 0;
      *(undefined4 *)(puVar5 + 3) = 0x20;
      puVar5[4] = &local_f8;
      Future<void>::startProc
                (&local_f8.future,
                 Future<void>::proc<Call<void>::Member<testFuture()::FutureTest>::Args1<int,int>>,
                 puVar5);
      Future<void>::join(&local_f8.future);
      if (((char)local_170.data != '\0') ||
         (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                ,0xcc,"t.called"), iVar4 == 0)) {
        Future<void>::~Future(&local_f8.future);
        Signal::Signal((Signal *)&local_f8,false);
        local_f8.future._aborting = false;
        local_f8.future._state = 0;
        local_f8.future._joinable = false;
        local_148.data = (Data *)CONCAT44(0x2a,local_148.data._0_4_);
        local_170.data = &local_170._data;
        local_170._data.ref = 0;
        local_170._data.str = "hallo1";
        local_170._data.len = 6;
        puVar5 = (undefined8 *)operator_new(0x50);
        *puVar5 = &local_148;
        puVar5[1] = testFuture::FutureTest::memberVoidTest2;
        puVar5[2] = 0;
        *(undefined4 *)(puVar5 + 3) = 0x20;
        String::String((String *)(puVar5 + 4),&local_170);
        puVar5[9] = &local_f8;
        Future<void>::startProc
                  (&local_f8.future,
                   Future<void>::
                   proc<Call<void>::Member<testFuture()::FutureTest>::Args2<int,String_const&,int,String>>
                   ,puVar5);
        if ((local_170.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_170.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
            operator_delete__(local_170.data);
          }
        }
        Future<void>::join(&local_f8.future);
        if (((char)local_148.data != '\0') ||
           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                  ,0xd4,"t.called"), iVar4 == 0)) {
          Future<void>::~Future(&local_f8.future);
          Signal::Signal((Signal *)&local_f8,false);
          local_f8.future._aborting = false;
          local_f8.future._state = 0;
          local_f8.future._joinable = false;
          local_120.data = (Data *)CONCAT44(0x2a,local_120.data._0_4_);
          local_170.data = &local_170._data;
          local_170._data.ref = 0;
          local_170._data.str = "hallo1";
          local_170._data.len = 6;
          local_148.data = &local_148._data;
          local_148._data.ref = 0;
          local_148._data.str = "hallo2";
          local_148._data.len = 6;
          puVar5 = (undefined8 *)operator_new(0x78);
          *puVar5 = &local_120;
          puVar5[1] = testFuture::FutureTest::memberVoidTest3;
          puVar5[2] = 0;
          *(undefined4 *)(puVar5 + 3) = 0x20;
          String::String((String *)(puVar5 + 4),&local_170);
          String::String((String *)(puVar5 + 9),&local_148);
          puVar5[0xe] = &local_f8;
          Future<void>::startProc
                    (&local_f8.future,
                     Future<void>::
                     proc<Call<void>::Member<testFuture()::FutureTest>::Args3<int,String_const&,String_const&,int,String,String>>
                     ,puVar5);
          if ((local_148.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_148.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
              operator_delete__(local_148.data);
            }
          }
          if ((local_170.data)->ref != 0) {
            LOCK();
            puVar1 = &(local_170.data)->ref;
            *puVar1 = *puVar1 - 1;
            UNLOCK();
            if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
              operator_delete__(local_170.data);
            }
          }
          Future<void>::join(&local_f8.future);
          if (((char)local_120.data != '\0') ||
             (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                    ,0xdc,"t.called"), iVar4 == 0)) {
            Future<void>::~Future(&local_f8.future);
            Signal::Signal((Signal *)&local_f8,false);
            local_f8.future._aborting = false;
            local_f8.future._state = 0;
            local_f8.future._joinable = false;
            local_80.data = (Data *)CONCAT44(0x2a,local_80.data._0_4_);
            local_170.data = &local_170._data;
            local_170._data.ref = 0;
            local_170._data.str = "hallo1";
            local_170._data.len = 6;
            local_148.data = &local_148._data;
            local_148._data.ref = 0;
            local_148._data.str = "hallo2";
            local_148._data.len = 6;
            local_120.data = &local_120._data;
            local_120._data.ref = 0;
            local_120._data.str = "hallo3";
            local_120._data.len = 6;
            plVar6 = (long *)operator_new(0xa0);
            *plVar6 = (long)&local_80;
            plVar6[1] = (long)testFuture::FutureTest::memberVoidTest4;
            plVar6[2] = 0;
            *(undefined4 *)(plVar6 + 3) = 0x20;
            String::String((String *)(plVar6 + 4),&local_170);
            String::String((String *)(plVar6 + 9),&local_148);
            String::String((String *)(plVar6 + 0xe),&local_120);
            plVar6[0x13] = (long)&local_f8;
            Future<void>::startProc
                      (&local_f8.future,
                       Future<void>::
                       proc<Call<void>::Member<testFuture()::FutureTest>::Args4<int,String_const&,String_const&,String_const&,int,String,String,String>>
                       ,plVar6);
            if ((local_120.data)->ref != 0) {
              LOCK();
              puVar1 = &(local_120.data)->ref;
              *puVar1 = *puVar1 - 1;
              UNLOCK();
              if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
                operator_delete__(local_120.data);
              }
            }
            pDVar2 = &local_170._data;
            if ((local_148.data)->ref != 0) {
              LOCK();
              puVar1 = &(local_148.data)->ref;
              *puVar1 = *puVar1 - 1;
              UNLOCK();
              if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                operator_delete__(local_148.data);
              }
            }
            if ((local_170.data)->ref != 0) {
              LOCK();
              puVar1 = &(local_170.data)->ref;
              *puVar1 = *puVar1 - 1;
              UNLOCK();
              if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                operator_delete__(local_170.data);
              }
            }
            Future<void>::join(&local_f8.future);
            if (((char)local_80.data != '\0') ||
               (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                      ,0xe4,"t.called"), iVar4 == 0)) {
              Future<void>::~Future(&local_f8.future);
              Signal::Signal((Signal *)&local_f8,false);
              local_f8.future._aborting = false;
              local_f8.future._state = 0;
              local_f8.future._joinable = false;
              puVar5 = (undefined8 *)operator_new(0x10);
              *puVar5 = testFuture::FutureTest::staticTest0;
              puVar5[1] = &local_f8;
              Future<void>::startProc
                        (&local_f8.future,Future<unsigned_long>::proc<Call<unsigned_long>::Args0>,
                         puVar5);
              Future<void>::join(&local_f8.future);
              Future<void>::join(&local_f8.future);
              if ((local_f8.result == 0x20) ||
                 (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                        ,0xeb,"future == 32"), iVar4 == 0)) {
                Future<unsigned_long>::~Future(&local_f8);
                Signal::Signal((Signal *)&local_f8,false);
                local_f8.future._aborting = false;
                local_f8.future._state = 0;
                local_f8.future._joinable = false;
                local_170._data.ref = 0;
                local_170._data.str = "hello";
                local_170._data.len = 5;
                local_170.data = pDVar2;
                Future<unsigned_long>::start<String_const&,String>
                          (&local_f8,testFuture::FutureTest::staticTest1,&local_170);
                if ((local_170.data)->ref != 0) {
                  LOCK();
                  puVar1 = &(local_170.data)->ref;
                  *puVar1 = *puVar1 - 1;
                  UNLOCK();
                  if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                    operator_delete__(local_170.data);
                  }
                }
                Future<void>::join(&local_f8.future);
                Future<void>::join(&local_f8.future);
                if ((local_f8.result == 5) ||
                   (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                          ,0xf2,"future == 5"), iVar4 == 0)) {
                  Future<unsigned_long>::~Future(&local_f8);
                  Signal::Signal((Signal *)&local_f8,false);
                  local_f8.future._aborting = false;
                  local_f8.future._state = 0;
                  local_f8.future._joinable = false;
                  local_170._data.ref = 0;
                  local_170._data.str = "hello";
                  local_170._data.len = 5;
                  local_148.data = &local_148._data;
                  local_148._data.ref = 0;
                  local_148._data.str = "hello";
                  local_148._data.len = 5;
                  local_170.data = pDVar2;
                  Future<unsigned_long>::start<String_const&,String_const&,String,String>
                            (&local_f8,testFuture::FutureTest::staticTest2,&local_170,&local_148);
                  if ((local_148.data)->ref != 0) {
                    LOCK();
                    puVar1 = &(local_148.data)->ref;
                    *puVar1 = *puVar1 - 1;
                    UNLOCK();
                    if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                      operator_delete__(local_148.data);
                    }
                  }
                  if ((local_170.data)->ref != 0) {
                    LOCK();
                    puVar1 = &(local_170.data)->ref;
                    *puVar1 = *puVar1 - 1;
                    UNLOCK();
                    if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                      operator_delete__(local_170.data);
                    }
                  }
                  Future<void>::join(&local_f8.future);
                  Future<void>::join(&local_f8.future);
                  if ((local_f8.result == 10) ||
                     (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                            ,0xf9,"future == 10"), iVar4 == 0)) {
                    Future<unsigned_long>::~Future(&local_f8);
                    Signal::Signal((Signal *)&local_f8,false);
                    local_f8.future._aborting = false;
                    local_f8.future._state = 0;
                    local_f8.future._joinable = false;
                    local_170._data.ref = 0;
                    local_170._data.str = "hello";
                    local_170._data.len = 5;
                    local_148.data = &local_148._data;
                    local_148._data.ref = 0;
                    local_148._data.str = "hello";
                    local_148._data.len = 5;
                    local_120.data = &local_120._data;
                    local_120._data.ref = 0;
                    local_120._data.str = "hello";
                    local_120._data.len = 5;
                    local_170.data = pDVar2;
                    Future<unsigned_long>::
                    start<String_const&,String_const&,String_const&,String,String,String>
                              (&local_f8,testFuture::FutureTest::staticTest3,&local_170,&local_148,
                               &local_120);
                    if ((local_120.data)->ref != 0) {
                      LOCK();
                      puVar1 = &(local_120.data)->ref;
                      *puVar1 = *puVar1 - 1;
                      UNLOCK();
                      if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
                        operator_delete__(local_120.data);
                      }
                    }
                    if ((local_148.data)->ref != 0) {
                      LOCK();
                      puVar1 = &(local_148.data)->ref;
                      *puVar1 = *puVar1 - 1;
                      UNLOCK();
                      if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                        operator_delete__(local_148.data);
                      }
                    }
                    if ((local_170.data)->ref != 0) {
                      LOCK();
                      puVar1 = &(local_170.data)->ref;
                      *puVar1 = *puVar1 - 1;
                      UNLOCK();
                      if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                        operator_delete__(local_170.data);
                      }
                    }
                    Future<void>::join(&local_f8.future);
                    Future<void>::join(&local_f8.future);
                    if ((local_f8.result == 0xf) ||
                       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                              ,0x100,"future == 15"), iVar4 == 0)) {
                      Future<unsigned_long>::~Future(&local_f8);
                      Signal::Signal((Signal *)&local_f8,false);
                      local_f8.future._aborting = false;
                      local_f8.future._state = 0;
                      local_f8.future._joinable = false;
                      local_170._data.ref = 0;
                      local_170._data.str = "hello";
                      local_170._data.len = 5;
                      local_148.data = &local_148._data;
                      local_148._data.ref = 0;
                      local_148._data.str = "hello";
                      local_148._data.len = 5;
                      local_120.data = &local_120._data;
                      local_120._data.ref = 0;
                      local_120._data.str = "hello";
                      local_120._data.len = 5;
                      local_80.data = &local_80._data;
                      local_80._data.ref = 0;
                      local_80._data.str = "hello";
                      local_80._data.len = 5;
                      local_170.data = pDVar2;
                      Future<unsigned_long>::
                      start<String_const&,String_const&,String_const&,String_const&,String,String,String,String>
                                (&local_f8,testFuture::FutureTest::staticTest4,&local_170,&local_148
                                 ,&local_120,&local_80);
                      if ((local_80.data)->ref != 0) {
                        LOCK();
                        puVar1 = &(local_80.data)->ref;
                        *puVar1 = *puVar1 - 1;
                        UNLOCK();
                        if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
                          operator_delete__(local_80.data);
                        }
                      }
                      if ((local_120.data)->ref != 0) {
                        LOCK();
                        puVar1 = &(local_120.data)->ref;
                        *puVar1 = *puVar1 - 1;
                        UNLOCK();
                        if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
                          operator_delete__(local_120.data);
                        }
                      }
                      if ((local_148.data)->ref != 0) {
                        LOCK();
                        puVar1 = &(local_148.data)->ref;
                        *puVar1 = *puVar1 - 1;
                        UNLOCK();
                        if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                          operator_delete__(local_148.data);
                        }
                      }
                      if ((local_170.data)->ref != 0) {
                        LOCK();
                        puVar1 = &(local_170.data)->ref;
                        *puVar1 = *puVar1 - 1;
                        UNLOCK();
                        if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                          operator_delete__(local_170.data);
                        }
                      }
                      Future<void>::join(&local_f8.future);
                      Future<void>::join(&local_f8.future);
                      if ((local_f8.result == 0x14) ||
                         (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                                ,0x107,"future == 20"), iVar4 == 0)) {
                        Future<unsigned_long>::~Future(&local_f8);
                        Signal::Signal((Signal *)&local_f8,false);
                        local_f8.future._aborting = false;
                        local_f8.future._state = 0;
                        local_f8.future._joinable = false;
                        local_170._data.ref = 0;
                        local_170._data.str = "hello";
                        local_170._data.len = 5;
                        local_148.data = &local_148._data;
                        local_148._data.ref = 0;
                        local_148._data.str = "hello";
                        local_148._data.len = 5;
                        local_120.data = &local_120._data;
                        local_120._data.ref = 0;
                        local_120._data.str = "hello";
                        local_120._data.len = 5;
                        local_80.data = &local_80._data;
                        local_80._data.ref = 0;
                        local_80._data.str = "hello";
                        local_80._data.len = 5;
                        local_58.data = &local_58._data;
                        local_58._data.ref = 0;
                        local_58._data.str = "hello";
                        local_58._data.len = 5;
                        local_170.data = pDVar2;
                        Future<unsigned_long>::
                        start<String_const&,String_const&,String_const&,String_const&,String_const&,String,String,String,String,String>
                                  (&local_f8,testFuture::FutureTest::staticTest5,&local_170,
                                   &local_148,&local_120,&local_80,&local_58);
                        if ((local_58.data)->ref != 0) {
                          LOCK();
                          puVar1 = &(local_58.data)->ref;
                          *puVar1 = *puVar1 - 1;
                          UNLOCK();
                          if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
                            operator_delete__(local_58.data);
                          }
                        }
                        if ((local_80.data)->ref != 0) {
                          LOCK();
                          puVar1 = &(local_80.data)->ref;
                          *puVar1 = *puVar1 - 1;
                          UNLOCK();
                          if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
                            operator_delete__(local_80.data);
                          }
                        }
                        if ((local_120.data)->ref != 0) {
                          LOCK();
                          puVar1 = &(local_120.data)->ref;
                          *puVar1 = *puVar1 - 1;
                          UNLOCK();
                          if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
                            operator_delete__(local_120.data);
                          }
                        }
                        if ((local_148.data)->ref != 0) {
                          LOCK();
                          puVar1 = &(local_148.data)->ref;
                          *puVar1 = *puVar1 - 1;
                          UNLOCK();
                          if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                            operator_delete__(local_148.data);
                          }
                        }
                        if ((local_170.data)->ref != 0) {
                          LOCK();
                          puVar1 = &(local_170.data)->ref;
                          *puVar1 = *puVar1 - 1;
                          UNLOCK();
                          if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                            operator_delete__(local_170.data);
                          }
                        }
                        Future<void>::join(&local_f8.future);
                        Future<void>::join(&local_f8.future);
                        if ((local_f8.result == 0x19) ||
                           (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                                  ,0x10e,"future == 25"), iVar4 == 0)) {
                          Future<unsigned_long>::~Future(&local_f8);
                          Signal::Signal((Signal *)&local_f8,false);
                          local_f8.future._aborting = false;
                          local_f8.future._state = 0;
                          local_f8.future._joinable = false;
                          local_148.data = (Data *)CONCAT44(0x2a,local_148.data._0_4_);
                          local_170.data = &local_170._data;
                          local_170._data.ref = 0;
                          local_170._data.str = "hello";
                          local_170._data.len = 5;
                          puVar5 = (undefined8 *)operator_new(0x48);
                          *puVar5 = &local_148;
                          puVar5[1] = testFuture::FutureTest::memberTest1;
                          puVar5[2] = 0;
                          String::String((String *)(puVar5 + 3),&local_170);
                          puVar5[8] = &local_f8;
                          Future<void>::startProc
                                    (&local_f8.future,
                                     Future<unsigned_long>::
                                     proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args1<String_const&,String>>
                                     ,puVar5);
                          if ((local_170.data)->ref != 0) {
                            LOCK();
                            puVar1 = &(local_170.data)->ref;
                            *puVar1 = *puVar1 - 1;
                            UNLOCK();
                            if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                              operator_delete__(local_170.data);
                            }
                          }
                          Future<void>::join(&local_f8.future);
                          Future<void>::join(&local_f8.future);
                          if ((local_f8.result == 0x2f) ||
                             (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                                  ,0x116,"future == 42 + 5"), iVar4 == 0)) {
                            Future<unsigned_long>::~Future(&local_f8);
                            Signal::Signal((Signal *)&local_f8,false);
                            local_f8.future._aborting = false;
                            local_f8.future._state = 0;
                            local_f8.future._joinable = false;
                            local_120.data = (Data *)CONCAT44(0x2a,local_120.data._0_4_);
                            local_170.data = &local_170._data;
                            local_170._data.ref = 0;
                            local_170._data.str = "hello1";
                            local_170._data.len = 6;
                            local_148.data = &local_148._data;
                            local_148._data.ref = 0;
                            local_148._data.str = "hello2";
                            local_148._data.len = 6;
                            puVar5 = (undefined8 *)operator_new(0x70);
                            *puVar5 = &local_120;
                            puVar5[1] = testFuture::FutureTest::memberTest2;
                            puVar5[2] = 0;
                            String::String((String *)(puVar5 + 3),&local_170);
                            String::String((String *)(puVar5 + 8),&local_148);
                            puVar5[0xd] = &local_f8;
                            Future<void>::startProc
                                      (&local_f8.future,
                                       Future<unsigned_long>::
                                       proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args2<String_const&,String_const&,String,String>>
                                       ,puVar5);
                            if ((local_148.data)->ref != 0) {
                              LOCK();
                              puVar1 = &(local_148.data)->ref;
                              *puVar1 = *puVar1 - 1;
                              UNLOCK();
                              if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                                operator_delete__(local_148.data);
                              }
                            }
                            if ((local_170.data)->ref != 0) {
                              LOCK();
                              puVar1 = &(local_170.data)->ref;
                              *puVar1 = *puVar1 - 1;
                              UNLOCK();
                              if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                                operator_delete__(local_170.data);
                              }
                            }
                            Future<void>::join(&local_f8.future);
                            Future<void>::join(&local_f8.future);
                            if ((local_f8.result == 0x36) ||
                               (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                                  ,0x11e,"future == 42 + 6 * 2"), iVar4 == 0)) {
                              Future<unsigned_long>::~Future(&local_f8);
                              Signal::Signal((Signal *)&local_f8,false);
                              local_f8.future._aborting = false;
                              local_f8.future._state = 0;
                              local_f8.future._joinable = false;
                              local_80.data = (Data *)CONCAT44(0x2a,local_80.data._0_4_);
                              local_170.data = &local_170._data;
                              local_170._data.ref = 0;
                              local_170._data.str = "hello1";
                              local_170._data.len = 6;
                              local_148.data = &local_148._data;
                              local_148._data.ref = 0;
                              local_148._data.str = "hello2";
                              local_148._data.len = 6;
                              local_120.data = &local_120._data;
                              local_120._data.ref = 0;
                              local_120._data.str = "hello3";
                              local_120._data.len = 6;
                              puVar5 = (undefined8 *)operator_new(0x98);
                              *puVar5 = &local_80;
                              puVar5[1] = testFuture::FutureTest::memberTest3;
                              puVar5[2] = 0;
                              String::String((String *)(puVar5 + 3),&local_170);
                              String::String((String *)(puVar5 + 8),&local_148);
                              String::String((String *)(puVar5 + 0xd),&local_120);
                              puVar5[0x12] = &local_f8;
                              Future<void>::startProc
                                        (&local_f8.future,
                                         Future<unsigned_long>::
                                         proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args3<String_const&,String_const&,String_const&,String,String,String>>
                                         ,puVar5);
                              if ((local_120.data)->ref != 0) {
                                LOCK();
                                puVar1 = &(local_120.data)->ref;
                                *puVar1 = *puVar1 - 1;
                                UNLOCK();
                                if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
                                  operator_delete__(local_120.data);
                                }
                              }
                              if ((local_148.data)->ref != 0) {
                                LOCK();
                                puVar1 = &(local_148.data)->ref;
                                *puVar1 = *puVar1 - 1;
                                UNLOCK();
                                if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                                  operator_delete__(local_148.data);
                                }
                              }
                              if ((local_170.data)->ref != 0) {
                                LOCK();
                                puVar1 = &(local_170.data)->ref;
                                *puVar1 = *puVar1 - 1;
                                UNLOCK();
                                if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                                  operator_delete__(local_170.data);
                                }
                              }
                              Future<void>::join(&local_f8.future);
                              Future<void>::join(&local_f8.future);
                              if ((local_f8.result == 0x3c) ||
                                 (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                                  ,0x126,"future == 42 + 6 * 3"), iVar4 == 0)) {
                                Future<unsigned_long>::~Future(&local_f8);
                                Signal::Signal((Signal *)&local_f8,false);
                                local_f8.future._aborting = false;
                                local_f8.future._state = 0;
                                local_f8.future._joinable = false;
                                local_58.data = (Data *)CONCAT44(0x2a,local_58.data._0_4_);
                                local_170._data.ref = 0;
                                local_170._data.str = "hello1";
                                local_170._data.len = 6;
                                local_148.data = &local_148._data;
                                local_148._data.ref = 0;
                                local_148._data.str = "hello2";
                                local_148._data.len = 6;
                                local_120.data = &local_120._data;
                                local_120._data.ref = 0;
                                local_120._data.str = "hello3";
                                local_120._data.len = 6;
                                local_80.data = &local_80._data;
                                local_80._data.ref = 0;
                                local_80._data.str = "hello4";
                                local_80._data.len = 6;
                                local_170.data = &local_170._data;
                                plVar6 = (long *)operator_new(0xc0);
                                *plVar6 = (long)&local_58;
                                plVar6[1] = (long)testFuture::FutureTest::memberTest4;
                                plVar6[2] = 0;
                                String::String((String *)(plVar6 + 3),&local_170);
                                String::String((String *)(plVar6 + 8),&local_148);
                                String::String((String *)(plVar6 + 0xd),&local_120);
                                String::String((String *)(plVar6 + 0x12),&local_80);
                                plVar6[0x17] = (long)&local_f8;
                                Future<void>::startProc
                                          (&local_f8.future,
                                           Future<unsigned_long>::
                                           proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args4<String_const&,String_const&,String_const&,String_const&,String,String,String,String>>
                                           ,plVar6);
                                if ((local_80.data)->ref != 0) {
                                  LOCK();
                                  puVar1 = &(local_80.data)->ref;
                                  *puVar1 = *puVar1 - 1;
                                  UNLOCK();
                                  if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
                                    operator_delete__(local_80.data);
                                  }
                                }
                                if ((local_120.data)->ref != 0) {
                                  LOCK();
                                  puVar1 = &(local_120.data)->ref;
                                  *puVar1 = *puVar1 - 1;
                                  UNLOCK();
                                  if ((*puVar1 == 0) && (local_120.data != (Data *)0x0)) {
                                    operator_delete__(local_120.data);
                                  }
                                }
                                if ((local_148.data)->ref != 0) {
                                  LOCK();
                                  puVar1 = &(local_148.data)->ref;
                                  *puVar1 = *puVar1 - 1;
                                  UNLOCK();
                                  if ((*puVar1 == 0) && (local_148.data != (Data *)0x0)) {
                                    operator_delete__(local_148.data);
                                  }
                                }
                                if ((local_170.data)->ref != 0) {
                                  LOCK();
                                  puVar1 = &(local_170.data)->ref;
                                  *puVar1 = *puVar1 - 1;
                                  UNLOCK();
                                  if ((*puVar1 == 0) && (local_170.data != (Data *)0x0)) {
                                    operator_delete__(local_170.data);
                                  }
                                }
                                Future<void>::join(&local_f8.future);
                                Future<void>::join(&local_f8.future);
                                if ((local_f8.result == 0x42) ||
                                   (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                                                  ,0x12e,"future == 42 + 6 * 4"), iVar4 == 0)) {
                                  Future<unsigned_long>::~Future(&local_f8);
                                  return;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void testFuture()
{
  class FutureTest
  {
  public:
    bool called;

  public:
    FutureTest() : check(42) {}

    static void staticVoidTest0()
    {
    }

    static void staticVoidTest1(int check)
    {
      ASSERT(check == 32);
    }

    static void staticVoidTest2(int check, const String& str1)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
    }

    static void staticVoidTest3(int check, const String& str1, const String& str2)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
    }

    static void staticVoidTest4(int check, const String& str1, const String& str2, const String& str3)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
    }

    static void staticVoidTest5(int check, const String& str1, const String& str2, const String& str3, const String& str4)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
      ASSERT(str4 == "hallo4");
    }

    void memberVoidTest0()
    {
      called = true;
    }

    void memberVoidTest1(int check)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
    }

    void memberVoidTest2(int check, const String& str1)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
    }

    void memberVoidTest3(int check, const String& str1, const String& str2)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
    }

    void memberVoidTest4(int check, const String& str1, const String& str2, const String& str3)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
    }

    static usize staticTest0()
    {
      return 32;
    }

    static usize staticTest1(const String& str)
    {
      return str.length();
    }

    static usize staticTest2(const String& str1, const String& str2)
    {
      return str1.length() + str2.length();
    }

    static usize staticTest3(const String& str1, const String& str2, const String& str3)
    {
      return str1.length() + str2.length() + str3.length();
    }

    static usize staticTest4(const String& str1, const String& str2, const String& str3, const String& str4)
    {
      return str1.length() + str2.length() + str3.length() + str4.length();
    }

    static usize staticTest5(const String& str1, const String& str2, const String& str3, const String& str4, const String& str5)
    {
      return str1.length() + str2.length() + str3.length() + str4.length() + str5.length();
    }

    usize memberTest0()
    {
      return check;
    }

    usize memberTest1(const String& str)
    {
      return check + str.length();
    }

    usize memberTest2(const String& str1, const String& str2)
    {
      return check + str1.length() + str2.length();
    }

    usize memberTest3(const String& str1, const String& str2, const String& str3)
    {
      return check + str1.length() + str2.length() + str3.length();
    }

    usize memberTest4(const String& str1, const String& str2, const String& str3, const String& str4)
    {
      return check + str1.length() + str2.length() + str3.length() + str4.length();
    }

  private:
    int check;
  };

  {
    Future<void> future;
    ASSERT(!future.isAborting());
    ASSERT(!future.isFinished());
    ASSERT(!future.isAborted());
    future.start(&FutureTest::staticVoidTest0);
    future.join();
    ASSERT(!future.isAborting());
    ASSERT(future.isFinished());
    ASSERT(!future.isAborted());
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest1, 32);
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest2, 32, String("hallo1"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest3, 32, String("hallo1"), String("hallo2"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest4, 32, String("hallo1"), String("hallo2"), String("hallo3"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest5, 32, String("hallo1"), String("hallo2"), String("hallo3"), String("hallo4"));
    future.join();
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest0);
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest1, 32);
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest2, 32, String("hallo1"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest3, 32, String("hallo1"), String("hallo2"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest4, 32, String("hallo1"), String("hallo2"), String("hallo3"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest0);
    future.join();
    ASSERT(future == 32);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest1, String("hello"));
    future.join();
    ASSERT(future == 5);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest2, String("hello"), String("hello"));
    future.join();
    ASSERT(future == 10);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest3, String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 15);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest4, String("hello"), String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 20);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest5, String("hello"), String("hello"), String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 25);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest1, String("hello"));
    future.join();
    ASSERT(future == 42 + 5);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest2, String("hello1"), String("hello2"));
    future.join();
    ASSERT(future == 42 + 6 * 2);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest3, String("hello1"), String("hello2"), String("hello3"));
    future.join();
    ASSERT(future == 42 + 6 * 3);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest4, String("hello1"), String("hello2"), String("hello3"), String("hello4"));
    future.join();
    ASSERT(future == 42 + 6 * 4);
  }
}